

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

iterator __thiscall
fmt::v8::detail::default_arg_formatter<char>::operator()
          (default_arg_formatter<char> *this,bool value)

{
  appender aVar1;
  byte in_SIL;
  basic_format_specs<char> *in_RDI;
  locale_ref unaff_retaddr;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> in_stack_00000008;
  locale_ref local_38 [3];
  undefined8 local_20;
  byte local_11;
  undefined8 in_stack_fffffffffffffff8;
  undefined1 value_00;
  
  value_00 = (undefined1)((ulong)in_stack_fffffffffffffff8 >> 0x38);
  local_11 = in_SIL & 1;
  local_20._0_4_ = in_RDI->width;
  local_20._4_4_ = in_RDI->precision;
  basic_format_specs<char>::basic_format_specs((basic_format_specs<char> *)0x11ed71);
  locale_ref::locale_ref(local_38);
  aVar1 = write<char,_fmt::v8::appender,_bool,_0>
                    ((appender)in_stack_00000008.container,(bool)value_00,in_RDI,unaff_retaddr);
  return (iterator)
         aVar1.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container.container;
}

Assistant:

auto operator()(T value) -> iterator {
    return write<Char>(out, value);
  }